

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::Diagnostic>::
emplaceRealloc<slang::ast::Symbol_const&,slang::DiagCode&,slang::SourceLocation&>
          (SmallVectorBase<slang::Diagnostic> *this,pointer pos,Symbol *args,DiagCode *args_1,
          SourceLocation *args_2)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator pDVar4;
  long lVar5;
  pointer pDVar6;
  SourceLocation SVar7;
  iterator __result;
  SourceLocation in_RSI;
  SmallVectorBase<slang::Diagnostic> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  Symbol *in_stack_ffffffffffffff78;
  Diagnostic *in_stack_ffffffffffffff80;
  SourceLocation location;
  size_type in_stack_ffffffffffffff90;
  DiagCode code;
  
  sVar1 = in_RDI->len;
  sVar2 = max_size((SmallVectorBase<slang::Diagnostic> *)0x3d9b9e);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = calculateGrowth(in_RDI,in_stack_ffffffffffffff90);
  code = SUB84(in_stack_ffffffffffffff90 >> 0x20,0);
  location = in_RSI;
  pDVar4 = begin(in_RDI);
  lVar5 = (long)location - (long)pDVar4;
  pDVar6 = (pointer)operator_new(0x3d9c00);
  Diagnostic::Diagnostic(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,code,location);
  SVar7 = (SourceLocation)end(in_RDI);
  if (in_RSI == SVar7) {
    __result = begin(in_RDI);
    pDVar4 = end(in_RDI);
    std::uninitialized_move<slang::Diagnostic*,slang::Diagnostic*>
              ((Diagnostic *)in_RSI,(Diagnostic *)location,__result);
  }
  else {
    begin(in_RDI);
    std::uninitialized_move<slang::Diagnostic*,slang::Diagnostic*>
              ((Diagnostic *)in_RSI,(Diagnostic *)location,in_stack_ffffffffffffff80);
    pDVar4 = end(in_RDI);
    std::uninitialized_move<slang::Diagnostic*,slang::Diagnostic*>
              ((Diagnostic *)in_RSI,(Diagnostic *)location,in_stack_ffffffffffffff80);
  }
  cleanup(in_RDI,(EVP_PKEY_CTX *)pDVar4);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = pDVar6;
  return pDVar6 + lVar5 / 0x70;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}